

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

Promise<siginfo_t> __thiscall kj::UnixEventPort::onSignal(UnixEventPort *this,int signum)

{
  int in_EDX;
  undefined4 in_register_00000034;
  bool _kjCondition;
  int signum_local;
  Fault f;
  
  _kjCondition = (bool)(~(anonymous_namespace)::capturedChildExit & 1 | in_EDX != 0x11);
  if (_kjCondition != false) {
    newAdaptedPromise<siginfo_t,kj::UnixEventPort::SignalPromiseAdapter,kj::UnixEventPort&,int&>
              ((kj *)this,(UnixEventPort *)CONCAT44(in_register_00000034,signum),&signum_local);
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[87]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
             ,0x165,FAILED,"signum != SIGCHLD || !capturedChildExit",
             "_kjCondition,\"can\'t call onSigal(SIGCHLD) when kj::UnixEventPort::captureChildExit() has been called\""
             ,&_kjCondition,
             (char (*) [87])
             "can\'t call onSigal(SIGCHLD) when kj::UnixEventPort::captureChildExit() has been called"
            );
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

Promise<siginfo_t> UnixEventPort::onSignal(int signum) {
  KJ_REQUIRE(signum != SIGCHLD || !capturedChildExit,
      "can't call onSigal(SIGCHLD) when kj::UnixEventPort::captureChildExit() has been called");
  return newAdaptedPromise<siginfo_t, SignalPromiseAdapter>(*this, signum);
}